

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O0

void __thiscall
OpenMD::EAM::addExplicitInteraction
          (EAM *this,AtomType *atype1,AtomType *atype2,RealType dr,int nr,
          vector<double,_std::allocator<double>_> *phiVals)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  _Rb_tree_const_iterator<int> this_00;
  reference pvVar4;
  _Rb_tree_const_iterator<int> this_01;
  reference pvVar5;
  int in_ECX;
  AtomType *in_RDX;
  AtomType *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar6;
  pair<std::_Rb_tree_const_iterator<int>,_bool> ret;
  int eamtid2;
  int eamtid1;
  int atid2;
  int atid1;
  int i;
  vector<double,_std::allocator<double>_> rVals;
  CubicSplinePtr cs;
  EAMInteractionData mixer;
  value_type in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 uVar7;
  EAMInteractionData *in_stack_fffffffffffffe90;
  CubicSpline *in_stack_fffffffffffffea0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb0;
  set<int,_std::less<int>,_std::allocator<int>_> *this_02;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb8;
  CubicSpline *in_stack_fffffffffffffec0;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_118;
  _Base_ptr local_108;
  undefined1 local_100;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_f8;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_e8;
  value_type local_d8;
  value_type local_d4;
  int local_d0;
  int local_cc;
  pair<double,_double> local_c8;
  double local_b8;
  int local_ac;
  set<int,_std::less<int>,_std::allocator<int>_> local_70;
  double local_40;
  undefined1 local_38;
  int local_24;
  double local_20;
  AtomType *local_18;
  AtomType *local_10;
  
  local_24 = in_ECX;
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  local_10 = in_RSI;
  EAMInteractionData::EAMInteractionData(in_stack_fffffffffffffe90);
  std::make_shared<OpenMD::CubicSpline>();
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x3e9bf2);
  for (local_ac = 0; local_ac < local_24; local_ac = local_ac + 1) {
    local_b8 = (double)local_ac * local_20;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe90,
               (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
              );
  }
  std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3e9cb5);
  CubicSpline::addPoints
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  this_02 = &local_70;
  std::shared_ptr<OpenMD::CubicSpline>::operator=
            (&in_stack_fffffffffffffe90->phi,
             (shared_ptr<OpenMD::CubicSpline> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3e9cf0);
  local_c8 = CubicSpline::getLimits(in_stack_fffffffffffffea0);
  local_40 = local_c8.second;
  local_38 = 1;
  iVar2 = AtomType::getIdent(local_10);
  local_cc = iVar2;
  iVar3 = AtomType::getIdent(local_18);
  local_d0 = iVar3;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::
  pair<std::_Rb_tree_const_iterator<int>,_bool,_true>
            ((pair<std::_Rb_tree_const_iterator<int>,_bool> *)in_stack_fffffffffffffe90);
  pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    (this_02,(value_type_conflict1 *)CONCAT44(iVar2,iVar3));
  this_00 = pVar6.first._M_node;
  local_100 = pVar6.second;
  local_108 = this_00._M_node;
  local_f8.first._M_node = this_00._M_node;
  local_f8.second = (bool)local_100;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=(&local_e8,&local_f8);
  if ((local_e8.second & 1U) == 0) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_cc);
    local_d4 = *pvVar4;
  }
  else {
    local_d4 = *(value_type *)(in_RDI + 0x88);
    vVar1 = *(value_type *)(in_RDI + 0x88);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_cc);
    *pvVar4 = vVar1;
    *(int *)(in_RDI + 0x88) = *(int *)(in_RDI + 0x88) + 1;
  }
  pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    (this_02,(value_type_conflict1 *)CONCAT44(iVar2,iVar3));
  this_01 = pVar6.first._M_node;
  local_118.second = pVar6.second;
  uVar7 = CONCAT13(local_118.second,(int3)in_stack_fffffffffffffe8c);
  local_118.first._M_node = this_01._M_node;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=(&local_e8,&local_118);
  if ((local_e8.second & 1U) == 0) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_d0);
    local_d8 = *pvVar4;
  }
  else {
    local_d8 = *(value_type *)(in_RDI + 0x88);
    in_stack_fffffffffffffe88 = *(value_type *)(in_RDI + 0x88);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_d0);
    *pvVar4 = in_stack_fffffffffffffe88;
    *(int *)(in_RDI + 0x88) = *(int *)(in_RDI + 0x88) + 1;
  }
  std::
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ::resize((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
            *)this_02,CONCAT44(iVar2,iVar3));
  std::
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ::operator[]((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                *)(in_RDI + 0x70),(long)local_d4);
  std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
            ((vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_> *)
             this_02,CONCAT44(iVar2,iVar3));
  pvVar5 = std::
           vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
           ::operator[]((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                         *)(in_RDI + 0x70),(long)local_d4);
  std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::operator[]
            (pvVar5,(long)local_d8);
  EAMInteractionData::operator=
            ((EAMInteractionData *)this_01._M_node,
             (EAMInteractionData *)CONCAT44(uVar7,in_stack_fffffffffffffe88));
  if (local_d8 != local_d4) {
    std::
    vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
    ::operator[]((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                  *)(in_RDI + 0x70),(long)local_d8);
    std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
              ((vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_> *)
               this_02,CONCAT44(iVar2,iVar3));
    pvVar5 = std::
             vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
             ::operator[]((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                           *)(in_RDI + 0x70),(long)local_d8);
    std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::operator[]
              (pvVar5,(long)local_d4);
    EAMInteractionData::operator=
              ((EAMInteractionData *)this_01._M_node,
               (EAMInteractionData *)CONCAT44(uVar7,in_stack_fffffffffffffe88));
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_00._M_node);
  std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3ea03e);
  EAMInteractionData::~EAMInteractionData((EAMInteractionData *)this_01._M_node);
  return;
}

Assistant:

void EAM::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                   RealType dr, int nr,
                                   vector<RealType> phiVals) {
    EAMInteractionData mixer;
    CubicSplinePtr cs {std::make_shared<CubicSpline>()};
    vector<RealType> rVals;

    for (int i = 0; i < nr; i++)
      rVals.push_back(i * dr);

    cs->addPoints(rVals, phiVals);
    mixer.phi           = cs;
    mixer.rcut          = mixer.phi->getLimits().second;
    mixer.explicitlySet = true;

    int atid1 = atype1->getIdent();
    int atid2 = atype2->getIdent();

    int eamtid1, eamtid2;

    pair<set<int>::iterator, bool> ret;
    ret = EAMtypes.insert(atid1);
    if (ret.second == false) {
      // already had this type in the EAMMap, just get the eamtid:
      eamtid1 = EAMtids[atid1];
    } else {
      // didn't already have it, so make a new one and assign it:
      eamtid1        = nEAM_;
      EAMtids[atid1] = nEAM_;
      nEAM_++;
    }

    ret = EAMtypes.insert(atid2);
    if (ret.second == false) {
      // already had this type in the EAMMap, just get the eamtid:
      eamtid2 = EAMtids[atid2];
    } else {
      // didn't already have it, so make a new one and assign it:
      eamtid2        = nEAM_;
      EAMtids[atid2] = nEAM_;
      nEAM_++;
    }

    MixingMap.resize(nEAM_);
    MixingMap[eamtid1].resize(nEAM_);
    MixingMap[eamtid1][eamtid2] = mixer;

    if (eamtid2 != eamtid1) {
      MixingMap[eamtid2].resize(nEAM_);
      MixingMap[eamtid2][eamtid1] = mixer;
    }
    return;
  }